

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

void __thiscall ASN1Test_MBString_Test::TestBody(ASN1Test_MBString_Test *this)

{
  int *lhs;
  uchar *puVar1;
  anon_struct_40_3_b217a906 *paVar2;
  int iVar3;
  ASN1_STRING *pAVar4;
  ScopedTrace *this_00;
  char *pcVar5;
  char *message;
  char *in_R9;
  long lVar6;
  int *message_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  initializer_list<unsigned_char> __l_16;
  initializer_list<unsigned_char> __l_17;
  initializer_list<unsigned_char> __l_18;
  initializer_list<unsigned_char> __l_19;
  initializer_list<unsigned_char> __l_20;
  initializer_list<unsigned_char> __l_21;
  initializer_list<unsigned_char> __l_22;
  initializer_list<unsigned_char> __l_23;
  initializer_list<unsigned_char> __l_24;
  initializer_list<unsigned_char> __l_25;
  initializer_list<unsigned_char> __l_26;
  initializer_list<unsigned_char> __l_27;
  initializer_list<unsigned_char> __l_28;
  initializer_list<unsigned_char> __l_29;
  initializer_list<unsigned_char> __l_30;
  initializer_list<unsigned_char> __l_31;
  initializer_list<unsigned_char> __l_32;
  initializer_list<unsigned_char> __l_33;
  initializer_list<unsigned_char> __l_34;
  initializer_list<unsigned_char> __l_35;
  initializer_list<unsigned_char> __l_36;
  initializer_list<unsigned_char> __l_37;
  initializer_list<unsigned_char> __l_38;
  initializer_list<unsigned_char> __l_39;
  initializer_list<unsigned_char> __l_40;
  initializer_list<unsigned_char> __l_41;
  initializer_list<unsigned_char> __l_42;
  initializer_list<unsigned_char> __l_43;
  AssertionResult gtest_ar_;
  ASN1_STRING *str_1;
  pointer local_818;
  ASN1_STRING *str;
  undefined1 local_808;
  ScopedTrace gtest_trace_1620;
  undefined3 uStack_7ff;
  ScopedTrace gtest_trace_1619;
  undefined2 uStack_7fa;
  ASN1_STRING *old_str;
  allocator_type local_7ec;
  uchar local_7eb;
  allocator_type local_7ea;
  allocator_type local_7e9;
  allocator_type local_7e8;
  allocator_type local_7e7;
  allocator_type local_7e6;
  allocator_type local_7e5;
  ScopedTrace gtest_trace_1621;
  ScopedTrace gtest_trace_1724;
  undefined2 uStack_7de;
  allocator_type local_7d1;
  allocator_type local_7d0;
  allocator_type local_7cf;
  allocator_type local_7ce;
  uchar local_7cd;
  allocator_type local_7cc;
  undefined2 local_7cb;
  allocator_type local_7c9;
  uchar local_7c8;
  allocator_type local_7c7;
  uchar local_7c6;
  allocator_type local_7c5;
  uchar local_7c4;
  allocator_type local_7c3;
  uchar local_7c2;
  allocator_type local_7c1;
  uchar local_7c0;
  allocator_type local_7bf;
  uchar local_7be;
  allocator_type local_7bd;
  uchar local_7bc;
  allocator_type local_7bb;
  uchar local_7ba;
  allocator_type local_7b9;
  uchar local_7b8;
  allocator_type local_7b7;
  undefined2 local_7b6;
  allocator_type local_7b4;
  undefined2 local_7b3;
  allocator_type local_7b1;
  uchar local_7b0;
  allocator_type local_7af;
  uchar local_7ae;
  allocator_type local_7ad;
  allocator_type local_7ac;
  allocator_type local_7ab;
  allocator_type local_7aa;
  allocator_type local_7a9;
  uchar local_7a8 [2];
  allocator_type local_7a6;
  undefined2 local_7a5;
  allocator_type local_7a3;
  uchar local_7a2;
  allocator_type local_7a1;
  uchar local_7a0 [2];
  allocator_type local_79e;
  uchar local_79d;
  allocator_type local_79c;
  uchar local_79b;
  allocator_type local_79a;
  uchar local_799;
  anon_struct_40_3_b217a906 kInvalidTests [11];
  int local_5d8 [2];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined8 local_5a8;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined8 uStack_594;
  undefined4 local_588;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_580;
  undefined8 local_568;
  undefined4 local_560;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_558;
  undefined4 local_540;
  undefined4 local_538;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_530;
  undefined8 local_518;
  undefined4 local_510;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_508;
  undefined4 local_4f0;
  undefined4 local_4e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e0;
  undefined8 local_4c8;
  undefined4 local_4c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4b8;
  undefined4 local_4a0;
  undefined4 local_498;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_490;
  undefined8 local_478;
  undefined4 local_470;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_468;
  undefined4 local_450;
  undefined4 local_448;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_440;
  undefined8 local_428;
  undefined4 local_420;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  undefined4 local_400;
  undefined4 local_3f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  undefined4 local_3b0;
  undefined4 local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  undefined8 local_388;
  undefined4 local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_378;
  undefined4 local_360;
  undefined4 local_358;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_350;
  undefined8 local_338;
  undefined4 local_330;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  undefined4 local_310;
  undefined4 local_308;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_300;
  undefined8 local_2e8;
  undefined4 local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  undefined4 local_2c0;
  undefined4 local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  undefined8 local_298;
  undefined4 local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  undefined4 local_270;
  undefined4 local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  undefined8 local_248;
  undefined4 local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  undefined4 local_220;
  undefined4 local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_210;
  undefined8 local_1f8;
  undefined4 local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  undefined4 local_1d0;
  undefined4 local_1c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  undefined4 local_180;
  undefined4 local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  undefined8 local_158;
  undefined4 local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  undefined4 local_130;
  undefined4 local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  undefined8 local_108;
  undefined4 local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  undefined4 local_e0;
  undefined4 local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined8 local_b8;
  undefined4 local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined4 local_90;
  undefined4 local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  undefined8 local_68;
  undefined4 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined4 local_40;
  
  local_5d8[0] = 0x1000;
  local_5d0 = 0;
  uStack_5c8 = 0;
  local_5c0 = 0;
  local_5b8 = 0x2916;
  local_5b0 = 0x13;
  local_5a8 = 0;
  uStack_5a0 = 0;
  uStack_59c = 0;
  uStack_598 = 0;
  uStack_594 = 0;
  local_588 = 0x1000;
  local_7e5 = (allocator_type)0x61;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_7e5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_580,__l,&local_7e6);
  local_568 = 0x2916;
  local_560 = 0x13;
  local_7e7 = (allocator_type)0x61;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_7e7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_558,__l_00,&local_7e8);
  local_540 = 1;
  local_538 = 0x1000;
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0x2c2b2928273041;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_6_ = 0x3f3d3a2f2e2d;
  __l_01._M_len = 0xe;
  __l_01._M_array = &gtest_ar_.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_530,__l_01,&local_7e9);
  local_518 = 0x2916;
  local_510 = 0x13;
  str_1 = (ASN1_STRING *)0x2c2b292827304161;
  local_818 = (pointer)CONCAT26(local_818._6_2_,0x3f3d3a2f2e2d);
  __l_02._M_len = 0xe;
  __l_02._M_array = (iterator)&str_1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_508,__l_02,&local_7ea);
  local_4f0 = 0xe;
  local_4e8 = 0x1000;
  local_7eb = '*';
  __l_03._M_len = 1;
  __l_03._M_array = &local_7eb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_4e0,__l_03,&local_7ec);
  local_4c8 = 0x2916;
  local_4c0 = 0x16;
  local_799 = '*';
  __l_04._M_len = 1;
  __l_04._M_array = &local_799;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_4b8,__l_04,&local_79a);
  local_4a0 = 1;
  local_498 = 0x1000;
  local_79b = '\n';
  __l_05._M_len = 1;
  __l_05._M_array = &local_79b;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_490,__l_05,&local_79c);
  local_478 = 0x2916;
  local_470 = 0x16;
  local_79d = '\n';
  __l_06._M_len = 1;
  __l_06._M_array = &local_79d;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_468,__l_06,&local_79e);
  local_450 = 1;
  local_448 = 0x1000;
  local_7a0[0] = 0xc2;
  local_7a0[1] = 0x80;
  __l_07._M_len = 2;
  __l_07._M_array = local_7a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_440,__l_07,&local_7a1);
  local_428 = 0x2916;
  local_420 = 0x14;
  local_7a2 = 0x80;
  __l_08._M_len = 1;
  __l_08._M_array = &local_7a2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_418,__l_08,&local_7a3);
  local_400 = 1;
  local_3f8 = 0x1000;
  local_7a5 = 0x80c4;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&local_7a5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3f0,__l_09,&local_7a6);
  local_3d8 = 0x2916;
  local_3d0 = 0x1e;
  local_7a8[0] = '\x01';
  local_7a8[1] = '\0';
  __l_10._M_len = 2;
  __l_10._M_array = local_7a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3c8,__l_10,&local_7a9);
  local_3b0 = 1;
  local_3a8 = 0x1000;
  old_str = (ASN1_STRING *)CONCAT44(old_str._4_4_,0x808090f0);
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)&old_str;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3a0,__l_11,&local_7aa);
  local_388 = 0x2916;
  local_380 = 0x1c;
  _gtest_trace_1724 = 0x100;
  __l_12._M_len = 4;
  __l_12._M_array = (iterator)&gtest_trace_1724;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_378,__l_12,&local_7ab);
  local_360 = 1;
  local_358 = 0x1000;
  _gtest_trace_1619 = 0x808090f0;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&gtest_trace_1619;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_350,__l_13,&local_7ac);
  local_338 = 0x2816;
  local_330 = 0xc;
  _gtest_trace_1620 = 0x808090f0;
  __l_14._M_len = 4;
  __l_14._M_array = (iterator)&gtest_trace_1620;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328,__l_14,&local_7ad);
  local_310 = 1;
  local_308 = 0x1000;
  local_7ae = '\0';
  __l_15._M_len = 1;
  __l_15._M_array = &local_7ae;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_300,__l_15,&local_7af);
  local_2e8 = 0x2916;
  local_2e0 = 0x16;
  local_7b0 = '\0';
  __l_16._M_len = 1;
  __l_16._M_array = &local_7b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2d8,__l_16,&local_7b1);
  local_2c0 = 1;
  local_2b8 = 0x1000;
  local_7b3 = 0x6100;
  __l_17._M_len = 2;
  __l_17._M_array = (iterator)&local_7b3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2b0,__l_17,&local_7b4);
  local_298 = 0x2916;
  local_290 = 0x16;
  local_7b6 = 0x6100;
  __l_18._M_len = 2;
  __l_18._M_array = (iterator)&local_7b6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_288,__l_18,&local_7b7);
  local_270 = 2;
  local_268 = 0x1000;
  local_7b8 = 'a';
  __l_19._M_len = 1;
  __l_19._M_array = &local_7b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_260,__l_19,&local_7b9);
  local_248 = 2;
  local_240 = 0x13;
  local_7ba = 'a';
  __l_20._M_len = 1;
  __l_20._M_array = &local_7ba;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_238,__l_20,&local_7bb);
  local_220 = 1;
  local_218 = 0x1000;
  local_7bc = 'a';
  __l_21._M_len = 1;
  __l_21._M_array = &local_7bc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_210,__l_21,&local_7bd);
  local_1f8 = 0x10;
  local_1f0 = 0x16;
  local_7be = 'a';
  __l_22._M_len = 1;
  __l_22._M_array = &local_7be;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1e8,__l_22,&local_7bf);
  local_1d0 = 1;
  local_1c8 = 0x1000;
  local_7c0 = 'a';
  __l_23._M_len = 1;
  __l_23._M_array = &local_7c0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1c0,__l_23,&local_7c1);
  local_1a8 = 4;
  local_1a0 = 0x14;
  local_7c2 = 'a';
  __l_24._M_len = 1;
  __l_24._M_array = &local_7c2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_198,__l_24,&local_7c3);
  local_180 = 1;
  local_178 = 0x1000;
  local_7c4 = 'a';
  __l_25._M_len = 1;
  __l_25._M_array = &local_7c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_170,__l_25,&local_7c5);
  local_158 = 0x2000;
  local_150 = 0xc;
  local_7c6 = 'a';
  __l_26._M_len = 1;
  __l_26._M_array = &local_7c6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_148,__l_26,&local_7c7);
  local_130 = 1;
  local_128 = 0x1000;
  local_7c8 = 'a';
  __l_27._M_len = 1;
  __l_27._M_array = &local_7c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_120,__l_27,&local_7c9);
  local_108 = 0x800;
  local_100 = 0x1e;
  local_7cb = 0x6100;
  __l_28._M_len = 2;
  __l_28._M_array = (iterator)&local_7cb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f8,__l_28,&local_7cc);
  local_e0 = 1;
  local_d8 = 0x1000;
  local_7cd = 'a';
  __l_29._M_len = 1;
  __l_29._M_array = &local_7cd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_d0,__l_29,&local_7ce);
  local_b8 = 0x100;
  local_b0 = 0x1c;
  _gtest_trace_1621 = 0x61000000;
  __l_30._M_len = 4;
  __l_30._M_array = (iterator)&gtest_trace_1621;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_30,&local_7cf);
  local_90 = 1;
  local_88 = 0x1000;
  str = (ASN1_STRING *)0x8090f080c480c261;
  local_808 = 0x80;
  __l_31._M_len = 9;
  __l_31._M_array = (iterator)&str;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_80,__l_31,&local_7d0);
  local_68 = 0x100;
  local_60 = 0x1c;
  kInvalidTests[0].format = 0x61000000;
  kInvalidTests[0]._4_4_ = 0x80000000;
  kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x10000010000;
  __l_32._M_len = 0x10;
  __l_32._M_array = (iterator)kInvalidTests;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_58,__l_32,&local_7d1);
  message_00 = local_5d8;
  local_40 = 4;
  lVar6 = 0x5a0;
  do {
    if (lVar6 == 0) {
      kInvalidTests[0].format = 0x1000;
      _gtest_trace_1620 = CONCAT31(uStack_7ff,0xff);
      __l_33._M_len = 1;
      __l_33._M_array = (iterator)&gtest_trace_1620;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[0].in,__l_33,(allocator_type *)&gtest_trace_1621);
      kInvalidTests[0].mask = 0x2000;
      kInvalidTests[1].format = 0x1002;
      local_7a0[0] = 0xff;
      __l_34._M_len = 1;
      __l_34._M_array = local_7a0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[1].in,__l_34,(allocator_type *)&local_7a5);
      kInvalidTests[1].mask = 0x2000;
      kInvalidTests[2].format = 0x1004;
      local_7a8[0] = 0xff;
      __l_35._M_len = 1;
      __l_35._M_array = local_7a8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[2].in,__l_35,(allocator_type *)&local_7b3);
      kInvalidTests[2].mask = 0x2000;
      kInvalidTests[3].format = 0x1000;
      str = (ASN1_STRING *)CONCAT53(str._3_5_,0x80a0ed);
      __l_36._M_len = 3;
      __l_36._M_array = (iterator)&str;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[3].in,__l_36,(allocator_type *)&local_7b6);
      kInvalidTests[3].mask = 0x2000;
      kInvalidTests[4].format = 0x1002;
      old_str = (ASN1_STRING *)CONCAT62(old_str._2_6_,0xd8);
      __l_37._M_len = 2;
      __l_37._M_array = (iterator)&old_str;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[4].in,__l_37,(allocator_type *)&local_7cb);
      kInvalidTests[4].mask = 0x2000;
      kInvalidTests[5].format = 0x1004;
      gtest_ar_._0_4_ = 0xd80000;
      __l_38._M_len = 4;
      __l_38._M_array = &gtest_ar_.success_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[5].in,__l_38,&local_7e5);
      kInvalidTests[5].mask = 0x2000;
      kInvalidTests[6].format = 0x1000;
      local_7e6 = (allocator_type)0xa;
      __l_39._M_len = 1;
      __l_39._M_array = (iterator)&local_7e6;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[6].in,__l_39,&local_7e7);
      kInvalidTests[6].mask = 2;
      kInvalidTests[7].format = 0x1000;
      _gtest_trace_1724 = CONCAT22(uStack_7de,0x80c2);
      __l_40._M_len = 2;
      __l_40._M_array = (iterator)&gtest_trace_1724;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[7].in,__l_40,&local_7e8);
      kInvalidTests[7].mask = 0x12;
      kInvalidTests[8].format = 0x1000;
      _gtest_trace_1619 = CONCAT22(uStack_7fa,0x80c4);
      __l_41._M_len = 2;
      __l_41._M_array = (iterator)&gtest_trace_1619;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[8].in,__l_41,&local_7e9);
      kInvalidTests[8].mask = 0x16;
      kInvalidTests[9].format = 0x1000;
      str_1 = (ASN1_STRING *)CONCAT44(str_1._4_4_,0x808090f0);
      __l_42._M_len = 4;
      __l_42._M_array = (iterator)&str_1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[9].in,__l_42,&local_7ea);
      kInvalidTests[9].mask = 0x816;
      kInvalidTests[10].format = 0x1000;
      local_7eb = '\n';
      __l_43._M_len = 1;
      __l_43._M_array = &local_7eb;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&kInvalidTests[10].in,__l_43,&local_7ec);
      kInvalidTests[10].mask = 0x10002;
      for (lVar6 = 0; lVar6 != 0x1b8; lVar6 = lVar6 + 0x28) {
        testing::ScopedTrace::ScopedTrace<int>
                  (&gtest_trace_1724,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x6bc,(int *)((long)&kInvalidTests[0].format + lVar6));
        gtest_ar_._0_8_ =
             *(long *)((long)&kInvalidTests[0].in.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar6);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(*(long *)((long)&kInvalidTests[0].in.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + lVar6) -
               gtest_ar_._0_8_);
        testing::ScopedTrace::ScopedTrace<Bytes>
                  (&gtest_trace_1619,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x6bd,(Bytes *)&gtest_ar_);
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&gtest_trace_1620,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x6be,(unsigned_long *)((long)&kInvalidTests[0].mask + lVar6));
        str_1 = (ASN1_STRING *)CONCAT44(str_1._4_4_,0xffffffff);
        puVar1 = *(uchar **)
                  ((long)&kInvalidTests[0].in.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar6);
        iVar3 = ASN1_mbstring_copy((ASN1_STRING **)0x0,puVar1,
                                   (int)*(undefined8 *)
                                         ((long)&kInvalidTests[0].in.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + lVar6)
                                   - (int)puVar1,*(int *)((long)&kInvalidTests[0].format + lVar6),
                                   *(ulong *)((long)&kInvalidTests[0].mask + lVar6));
        str = (ASN1_STRING *)CONCAT44(str._4_4_,iVar3);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"-1",
                   "ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(), t.format, t.mask)",
                   (int *)&str_1,(int *)&str);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&str_1);
          pcVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&str,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x6c1,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&str,(Message *)&str_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str);
          if (str_1 != (ASN1_STRING *)0x0) {
            (**(code **)(*(long *)str_1 + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        str_1 = (ASN1_STRING *)0x0;
        str = (ASN1_STRING *)CONCAT44(str._4_4_,0xffffffff);
        puVar1 = *(uchar **)
                  ((long)&kInvalidTests[0].in.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar6);
        iVar3 = ASN1_mbstring_copy((ASN1_STRING **)&str_1,puVar1,
                                   (int)*(undefined8 *)
                                         ((long)&kInvalidTests[0].in.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + lVar6)
                                   - (int)puVar1,*(int *)((long)&kInvalidTests[0].format + lVar6),
                                   *(ulong *)((long)&kInvalidTests[0].mask + lVar6));
        old_str = (ASN1_STRING *)CONCAT44(old_str._4_4_,iVar3);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"-1",
                   "ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask)",
                   (int *)&str,(int *)&old_str);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&str);
          pcVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&old_str,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x6c6,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&old_str,(Message *)&str);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_str);
          if (str != (ASN1_STRING *)0x0) {
            (**(code **)(*(long *)str + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        testing::internal::EqHelper::Compare<asn1_string_st>
                  ((EqHelper *)&gtest_ar_,"nullptr","str",(nullptr_t)0x0,str_1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&str);
          pcVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&old_str,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x6c8,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&old_str,(Message *)&str);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_str);
          if (str != (ASN1_STRING *)0x0) {
            (**(code **)(*(long *)str + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_1620);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_1619);
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_1724);
      }
      lVar6 = 0x198;
      do {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&kInvalidTests[0].format + lVar6));
        lVar6 = lVar6 + -0x28;
      } while (lVar6 != -0x20);
LAB_001b95b5:
      lVar6 = 0x550;
      do {
        TestBody()::$_0::~__0((__0 *)((long)local_5d8 + lVar6));
        lVar6 = lVar6 + -0x50;
      } while (lVar6 != -0x50);
      return;
    }
    testing::ScopedTrace::ScopedTrace<int>
              (&gtest_trace_1619,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x653,message_00);
    kInvalidTests[0]._0_8_ = *(undefined8 *)(message_00 + 2);
    kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(*(long *)(message_00 + 4) - kInvalidTests[0]._0_8_)
    ;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_1620,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x654,(Bytes *)kInvalidTests);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&gtest_trace_1621,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x655,(unsigned_long *)(message_00 + 8));
    iVar3 = ASN1_mbstring_copy((ASN1_STRING **)0x0,*(uchar **)(message_00 + 2),
                               (int)*(undefined8 *)(message_00 + 4) -
                               (int)*(uchar **)(message_00 + 2),*message_00,
                               *(ulong *)(message_00 + 8));
    lhs = message_00 + 10;
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type",
               "ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(), t.format, t.mask)",lhs,
               (int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x65a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    str = (ASN1_STRING *)0x0;
    iVar3 = ASN1_mbstring_copy((ASN1_STRING **)&str,*(uchar **)(message_00 + 2),
                               (int)*(undefined8 *)(message_00 + 4) -
                               (int)*(uchar **)(message_00 + 2),*message_00,
                               *(ulong *)(message_00 + 8));
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type",
               "ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask)",lhs,
               (int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x660,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = str != (ASN1_STRING *)0x0;
    if (str == (ASN1_STRING *)0x0) {
      testing::Message::Message((Message *)&str_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)kInvalidTests,(internal *)&gtest_ar_,(AssertionResult *)0x4934ea,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&old_str,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x661,(char *)kInvalidTests[0]._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&old_str,(Message *)&str_1);
LAB_001b9485:
      this_00 = (ScopedTrace *)&old_str;
LAB_001b9518:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      std::__cxx11::string::~string((string *)kInvalidTests);
      if (str_1 != (ASN1_STRING *)0x0) {
        (**(code **)(*(long *)str_1 + 8))();
      }
      paVar2 = (anon_struct_40_3_b217a906 *)&gtest_ar_;
LAB_001b9592:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&paVar2->in);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1621);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1620);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1619);
      goto LAB_001b95b5;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar3 = ASN1_STRING_type((ASN1_STRING *)str);
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type","ASN1_STRING_type(str)",lhs,
               (int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x662,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    gtest_ar_._0_8_ = *(undefined8 *)(message_00 + 0xc);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(*(long *)(message_00 + 0xe) - gtest_ar_._0_8_);
    pAVar4 = (ASN1_STRING *)ASN1_STRING_get0_data(str);
    iVar3 = ASN1_STRING_length((ASN1_STRING *)str);
    local_818 = (pointer)(long)iVar3;
    str_1 = pAVar4;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)kInvalidTests,"Bytes(t.expected_data)",
               "Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str))",(Bytes *)&gtest_ar_,
               (Bytes *)&str_1);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x664,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    ASN1_STRING_free((ASN1_STRING *)str);
    str = (ASN1_STRING *)ASN1_STRING_new();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = str != (ASN1_STRING *)0x0;
    if (str == (ASN1_STRING *)0x0) {
      testing::Message::Message((Message *)&str_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)kInvalidTests,(internal *)&gtest_ar_,(AssertionResult *)0x4934ea,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&old_str,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x669,(char *)kInvalidTests[0]._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&old_str,(Message *)&str_1);
      goto LAB_001b9485;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    old_str = str;
    iVar3 = ASN1_mbstring_copy((ASN1_STRING **)&str,*(uchar **)(message_00 + 2),
                               (int)*(undefined8 *)(message_00 + 4) -
                               (int)*(uchar **)(message_00 + 2),*message_00,
                               *(ulong *)(message_00 + 8));
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type",
               "ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask)",lhs,
               (int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x66d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    testing::internal::CmpHelperEQ<asn1_string_st*,asn1_string_st*>
              ((internal *)kInvalidTests,"old_str","str",&old_str,&str);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x66e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      paVar2 = kInvalidTests;
      goto LAB_001b9592;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    iVar3 = ASN1_STRING_type((ASN1_STRING *)str);
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type","ASN1_STRING_type(str)",lhs,
               (int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x66f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    gtest_ar_._0_8_ = *(undefined8 *)(message_00 + 0xc);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(*(long *)(message_00 + 0xe) - gtest_ar_._0_8_);
    pAVar4 = (ASN1_STRING *)ASN1_STRING_get0_data(str);
    iVar3 = ASN1_STRING_length((ASN1_STRING *)str);
    local_818 = (pointer)(long)iVar3;
    str_1 = pAVar4;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)kInvalidTests,"Bytes(t.expected_data)",
               "Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str))",(Bytes *)&gtest_ar_,
               (Bytes *)&str_1);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x671,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    ASN1_STRING_free((ASN1_STRING *)str);
    str = (ASN1_STRING *)0x0;
    iVar3 = ASN1_mbstring_ncopy((ASN1_STRING **)0x0,*(uchar **)(message_00 + 2),
                                (int)*(undefined8 *)(message_00 + 4) -
                                (int)*(uchar **)(message_00 + 2),*message_00,
                                *(ulong *)(message_00 + 8),(long)message_00[0x12],
                                (long)message_00[0x12]);
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type",
               "ASN1_mbstring_ncopy(nullptr, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints, t.num_codepoints)"
               ,lhs,(int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x679,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    pcVar5 = (char *)(long)message_00[0x12];
    iVar3 = ASN1_mbstring_ncopy((ASN1_STRING **)&str,*(uchar **)(message_00 + 2),
                                (int)*(undefined8 *)(message_00 + 4) -
                                (int)*(uchar **)(message_00 + 2),*message_00,
                                *(ulong *)(message_00 + 8),(long)pcVar5,(long)pcVar5);
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type",
               "ASN1_mbstring_ncopy(&str, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints, t.num_codepoints)"
               ,lhs,(int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      message = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        message = *(char **)kInvalidTests[0].in.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x67e,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = str != (ASN1_STRING *)0x0;
    if (str == (ASN1_STRING *)0x0) {
      testing::Message::Message((Message *)&str_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)kInvalidTests,(internal *)&gtest_ar_,(AssertionResult *)0x4934ea,"false",
                 "true",pcVar5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_trace_1724,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x67f,(char *)kInvalidTests[0]._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_trace_1724,(Message *)&str_1);
      this_00 = &gtest_trace_1724;
      goto LAB_001b9518;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar3 = ASN1_STRING_type((ASN1_STRING *)str);
    gtest_ar_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"t.expected_type","ASN1_STRING_type(str)",lhs,
               (int *)&gtest_ar_);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x680,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    gtest_ar_._0_8_ = *(undefined8 *)(message_00 + 0xc);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(*(long *)(message_00 + 0xe) - gtest_ar_._0_8_);
    pAVar4 = (ASN1_STRING *)ASN1_STRING_get0_data(str);
    iVar3 = ASN1_STRING_length((ASN1_STRING *)str);
    local_818 = (pointer)(long)iVar3;
    str_1 = pAVar4;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)kInvalidTests,"Bytes(t.expected_data)",
               "Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str))",(Bytes *)&gtest_ar_,
               (Bytes *)&str_1);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x682,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    ASN1_STRING_free((ASN1_STRING *)str);
    str = (ASN1_STRING *)0x0;
    gtest_ar_._0_4_ = 0xffffffff;
    iVar3 = ASN1_mbstring_ncopy((ASN1_STRING **)0x0,*(uchar **)(message_00 + 2),
                                (int)*(undefined8 *)(message_00 + 4) -
                                (int)*(uchar **)(message_00 + 2),*message_00,
                                *(ulong *)(message_00 + 8),(long)message_00[0x12] + 1,0);
    str_1 = (ASN1_STRING *)CONCAT44(str_1._4_4_,iVar3);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"-1",
               "ASN1_mbstring_ncopy( nullptr, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints + 1, 0)"
               ,(int *)&gtest_ar_,(int *)&str_1);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x688,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    ERR_clear_error();
    gtest_ar_._0_4_ = 0xffffffff;
    in_R9 = (char *)((long)message_00[0x12] + 1);
    iVar3 = ASN1_mbstring_ncopy((ASN1_STRING **)&str,*(uchar **)(message_00 + 2),
                                (int)*(undefined8 *)(message_00 + 4) -
                                (int)*(uchar **)(message_00 + 2),*message_00,
                                *(ulong *)(message_00 + 8),(long)in_R9,0);
    str_1 = (ASN1_STRING *)CONCAT44(str_1._4_4_,iVar3);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)kInvalidTests,"-1",
               "ASN1_mbstring_ncopy( &str, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints + 1, 0)"
               ,(int *)&gtest_ar_,(int *)&str_1);
    if ((char)kInvalidTests[0].format == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pcVar5 = *(char **)kInvalidTests[0].in.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x68c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].in);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = str == (ASN1_STRING *)0x0;
    if (str != (ASN1_STRING *)0x0) {
      testing::Message::Message((Message *)&str_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)kInvalidTests,(internal *)&gtest_ar_,(AssertionResult *)0x4934ea,"true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_trace_1724,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x68d,(char *)kInvalidTests[0]._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_trace_1724,(Message *)&str_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_1724);
      std::__cxx11::string::~string((string *)kInvalidTests);
      if (str_1 != (ASN1_STRING *)0x0) {
        (**(code **)(*(long *)str_1 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    ERR_clear_error();
    if (1 < message_00[0x12]) {
      gtest_ar_._0_4_ = 0xffffffff;
      iVar3 = ASN1_mbstring_ncopy((ASN1_STRING **)0x0,*(uchar **)(message_00 + 2),
                                  (int)*(undefined8 *)(message_00 + 4) -
                                  (int)*(uchar **)(message_00 + 2),*message_00,
                                  *(ulong *)(message_00 + 8),0,(ulong)(message_00[0x12] - 1));
      str_1 = (ASN1_STRING *)CONCAT44(str_1._4_4_,iVar3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)kInvalidTests,"-1",
                 "ASN1_mbstring_ncopy( nullptr, t.in.data(), t.in.size(), t.format, t.mask, 0, t.num_codepoints - 1)"
                 ,(int *)&gtest_ar_,(int *)&str_1);
      if ((char)kInvalidTests[0].format == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pcVar5 = *(char **)kInvalidTests[0].in.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&str_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x692,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&kInvalidTests[0].in);
      ERR_clear_error();
      gtest_ar_._0_4_ = 0xffffffff;
      in_R9 = (char *)0x0;
      iVar3 = ASN1_mbstring_ncopy((ASN1_STRING **)&str,*(uchar **)(message_00 + 2),
                                  (int)*(undefined8 *)(message_00 + 4) -
                                  (int)*(uchar **)(message_00 + 2),*message_00,
                                  *(ulong *)(message_00 + 8),0,(long)message_00[0x12] + -1);
      str_1 = (ASN1_STRING *)CONCAT44(str_1._4_4_,iVar3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)kInvalidTests,"-1",
                 "ASN1_mbstring_ncopy( &str, t.in.data(), t.in.size(), t.format, t.mask, 0, t.num_codepoints - 1)"
                 ,(int *)&gtest_ar_,(int *)&str_1);
      if ((char)kInvalidTests[0].format == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if (kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pcVar5 = *(char **)kInvalidTests[0].in.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&str_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x696,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&kInvalidTests[0].in);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = str == (ASN1_STRING *)0x0;
      if (str != (ASN1_STRING *)0x0) {
        testing::Message::Message((Message *)&str_1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)kInvalidTests,(internal *)&gtest_ar_,(AssertionResult *)0x4934ea,"true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_trace_1724,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x697,(char *)kInvalidTests[0]._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_trace_1724,(Message *)&str_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_1724);
        std::__cxx11::string::~string((string *)kInvalidTests);
        if (str_1 != (ASN1_STRING *)0x0) {
          (**(code **)(*(long *)str_1 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ERR_clear_error();
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1621);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1620);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1619);
    lVar6 = lVar6 + -0x50;
    message_00 = message_00 + 0x14;
  } while( true );
}

Assistant:

TEST(ASN1Test, MBString) {
  const unsigned long kAll = B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING |
                             B_ASN1_T61STRING | B_ASN1_BMPSTRING |
                             B_ASN1_UNIVERSALSTRING | B_ASN1_UTF8STRING;

  const struct {
    int format;
    std::vector<uint8_t> in;
    unsigned long mask;
    int expected_type;
    std::vector<uint8_t> expected_data;
    int num_codepoints;
  } kTests[] = {
      // Given a choice of formats, we pick the smallest that fits.
      {MBSTRING_UTF8, {}, kAll, V_ASN1_PRINTABLESTRING, {}, 0},
      {MBSTRING_UTF8, {'a'}, kAll, V_ASN1_PRINTABLESTRING, {'a'}, 1},
      {MBSTRING_UTF8,
       {'a', 'A', '0', '\'', '(', ')', '+', ',', '-', '.', '/', ':', '=', '?'},
       kAll,
       V_ASN1_PRINTABLESTRING,
       {'a', 'A', '0', '\'', '(', ')', '+', ',', '-', '.', '/', ':', '=', '?'},
       14},
      {MBSTRING_UTF8, {'*'}, kAll, V_ASN1_IA5STRING, {'*'}, 1},
      {MBSTRING_UTF8, {'\n'}, kAll, V_ASN1_IA5STRING, {'\n'}, 1},
      {MBSTRING_UTF8,
       {0xc2, 0x80 /* U+0080 */},
       kAll,
       V_ASN1_T61STRING,
       {0x80},
       1},
      {MBSTRING_UTF8,
       {0xc4, 0x80 /* U+0100 */},
       kAll,
       V_ASN1_BMPSTRING,
       {0x01, 0x00},
       1},
      {MBSTRING_UTF8,
       {0xf0, 0x90, 0x80, 0x80 /* U+10000 */},
       kAll,
       V_ASN1_UNIVERSALSTRING,
       {0x00, 0x01, 0x00, 0x00},
       1},
      {MBSTRING_UTF8,
       {0xf0, 0x90, 0x80, 0x80 /* U+10000 */},
       kAll & ~B_ASN1_UNIVERSALSTRING,
       V_ASN1_UTF8STRING,
       {0xf0, 0x90, 0x80, 0x80},
       1},

      // NUL is not printable. It should also not terminate iteration.
      {MBSTRING_UTF8, {0}, kAll, V_ASN1_IA5STRING, {0}, 1},
      {MBSTRING_UTF8, {0, 'a'}, kAll, V_ASN1_IA5STRING, {0, 'a'}, 2},

      // When a particular format is specified, we use it.
      {MBSTRING_UTF8,
       {'a'},
       B_ASN1_PRINTABLESTRING,
       V_ASN1_PRINTABLESTRING,
       {'a'},
       1},
      {MBSTRING_UTF8, {'a'}, B_ASN1_IA5STRING, V_ASN1_IA5STRING, {'a'}, 1},
      {MBSTRING_UTF8, {'a'}, B_ASN1_T61STRING, V_ASN1_T61STRING, {'a'}, 1},
      {MBSTRING_UTF8, {'a'}, B_ASN1_UTF8STRING, V_ASN1_UTF8STRING, {'a'}, 1},
      {MBSTRING_UTF8,
       {'a'},
       B_ASN1_BMPSTRING,
       V_ASN1_BMPSTRING,
       {0x00, 'a'},
       1},
      {MBSTRING_UTF8,
       {'a'},
       B_ASN1_UNIVERSALSTRING,
       V_ASN1_UNIVERSALSTRING,
       {0x00, 0x00, 0x00, 'a'},
       1},

      // A long string with characters of many widths, to test sizes are
      // measured in code points.
      {MBSTRING_UTF8,
       {
           'a',                     //
           0xc2, 0x80,              // U+0080
           0xc4, 0x80,              // U+0100
           0xf0, 0x90, 0x80, 0x80,  // U+10000
       },
       B_ASN1_UNIVERSALSTRING,
       V_ASN1_UNIVERSALSTRING,
       {
           0x00, 0x00, 0x00, 'a',   //
           0x00, 0x00, 0x00, 0x80,  //
           0x00, 0x00, 0x01, 0x00,  //
           0x00, 0x01, 0x00, 0x00,  //
       },
       4},
  };
  for (const auto &t : kTests) {
    SCOPED_TRACE(t.format);
    SCOPED_TRACE(Bytes(t.in));
    SCOPED_TRACE(t.mask);

    // Passing in nullptr should do a dry run.
    EXPECT_EQ(t.expected_type,
              ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(), t.format,
                                 t.mask));

    // Test allocating a new object.
    ASN1_STRING *str = nullptr;
    EXPECT_EQ(
        t.expected_type,
        ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask));
    ASSERT_TRUE(str);
    EXPECT_EQ(t.expected_type, ASN1_STRING_type(str));
    EXPECT_EQ(Bytes(t.expected_data),
              Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str)));

    // Test writing into an existing object.
    ASN1_STRING_free(str);
    str = ASN1_STRING_new();
    ASSERT_TRUE(str);
    ASN1_STRING *old_str = str;
    EXPECT_EQ(
        t.expected_type,
        ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask));
    ASSERT_EQ(old_str, str);
    EXPECT_EQ(t.expected_type, ASN1_STRING_type(str));
    EXPECT_EQ(Bytes(t.expected_data),
              Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str)));
    ASN1_STRING_free(str);
    str = nullptr;

    // minsize and maxsize should be enforced, even in a dry run.
    EXPECT_EQ(t.expected_type,
              ASN1_mbstring_ncopy(nullptr, t.in.data(), t.in.size(), t.format,
                                  t.mask, /*minsize=*/t.num_codepoints,
                                  /*maxsize=*/t.num_codepoints));

    EXPECT_EQ(t.expected_type,
              ASN1_mbstring_ncopy(&str, t.in.data(), t.in.size(), t.format,
                                  t.mask, /*minsize=*/t.num_codepoints,
                                  /*maxsize=*/t.num_codepoints));
    ASSERT_TRUE(str);
    EXPECT_EQ(t.expected_type, ASN1_STRING_type(str));
    EXPECT_EQ(Bytes(t.expected_data),
              Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str)));
    ASN1_STRING_free(str);
    str = nullptr;

    EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                      nullptr, t.in.data(), t.in.size(), t.format, t.mask,
                      /*minsize=*/t.num_codepoints + 1, /*maxsize=*/0));
    ERR_clear_error();
    EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                      &str, t.in.data(), t.in.size(), t.format, t.mask,
                      /*minsize=*/t.num_codepoints + 1, /*maxsize=*/0));
    EXPECT_FALSE(str);
    ERR_clear_error();
    if (t.num_codepoints > 1) {
      EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                        nullptr, t.in.data(), t.in.size(), t.format, t.mask,
                        /*minsize=*/0, /*maxsize=*/t.num_codepoints - 1));
      ERR_clear_error();
      EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                        &str, t.in.data(), t.in.size(), t.format, t.mask,
                        /*minsize=*/0, /*maxsize=*/t.num_codepoints - 1));
      EXPECT_FALSE(str);
      ERR_clear_error();
    }
  }

  const struct {
    int format;
    std::vector<uint8_t> in;
    unsigned long mask;
  } kInvalidTests[] = {
      // Invalid encodings are rejected.
      {MBSTRING_UTF8, {0xff}, B_ASN1_UTF8STRING},
      {MBSTRING_BMP, {0xff}, B_ASN1_UTF8STRING},
      {MBSTRING_UNIV, {0xff}, B_ASN1_UTF8STRING},

      // Lone surrogates are not code points.
      {MBSTRING_UTF8, {0xed, 0xa0, 0x80}, B_ASN1_UTF8STRING},
      {MBSTRING_BMP, {0xd8, 0x00}, B_ASN1_UTF8STRING},
      {MBSTRING_UNIV, {0x00, 0x00, 0xd8, 0x00}, B_ASN1_UTF8STRING},

      // The input does not fit in the allowed output types.
      {MBSTRING_UTF8, {'\n'}, B_ASN1_PRINTABLESTRING},
      {MBSTRING_UTF8,
       {0xc2, 0x80 /* U+0080 */},
       B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING},
      {MBSTRING_UTF8,
       {0xc4, 0x80 /* U+0100 */},
       B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING | B_ASN1_T61STRING},
      {MBSTRING_UTF8,
       {0xf0, 0x90, 0x80, 0x80 /* U+10000 */},
       B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING | B_ASN1_T61STRING |
           B_ASN1_BMPSTRING},

      // Unrecognized bits are ignored.
      {MBSTRING_UTF8, {'\n'}, B_ASN1_PRINTABLESTRING | B_ASN1_SEQUENCE},
  };
  for (const auto &t : kInvalidTests) {
    SCOPED_TRACE(t.format);
    SCOPED_TRACE(Bytes(t.in));
    SCOPED_TRACE(t.mask);

    EXPECT_EQ(-1, ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(),
                                     t.format, t.mask));
    ERR_clear_error();

    ASN1_STRING *str = nullptr;
    EXPECT_EQ(-1, ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format,
                                     t.mask));
    ERR_clear_error();
    EXPECT_EQ(nullptr, str);
  }
}